

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_CallFlowGraph.h
# Opt level: O0

CallSequenceCheckResults *
soul::CallFlowGraph::checkFunctionCallSequences
          (CallSequenceCheckResults *__return_storage_ptr__,Program *program)

{
  bool bVar1;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *pvVar2;
  Module *pMVar3;
  pool_ref<soul::heart::Function> *ppVar4;
  Function *pFVar5;
  ArrayView<soul::pool_ref<soul::heart::Function>_> AVar6;
  pool_ref<soul::heart::Function> *f_1;
  pool_ref<soul::heart::Function> *__end3_1;
  pool_ref<soul::heart::Function> *__begin3_1;
  ArrayView<soul::pool_ref<soul::heart::Function>_> local_a8;
  ArrayView<soul::pool_ref<soul::heart::Function>_> *local_98;
  ArrayView<soul::pool_ref<soul::heart::Function>_> *__range3_1;
  pool_ref<soul::Module> *m_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *__range2_1;
  pool_ref<soul::heart::Function> *f;
  pool_ref<soul::heart::Function> *__end3;
  pool_ref<soul::heart::Function> *__begin3;
  ArrayView<soul::pool_ref<soul::heart::Function>_> *local_40;
  ArrayView<soul::pool_ref<soul::heart::Function>_> *__range3;
  pool_ref<soul::Module> *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *__range2;
  Program *program_local;
  CallSequenceCheckResults *results;
  
  pvVar2 = Program::getModules(program);
  __end2 = std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ::begin(pvVar2);
  m = (pool_ref<soul::Module> *)
      std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::end
                (pvVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                                     *)&m), bVar1) {
    __range3 = (ArrayView<soul::pool_ref<soul::heart::Function>_> *)
               __gnu_cxx::
               __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
               ::operator*(&__end2);
    pMVar3 = pool_ref<soul::Module>::operator->((pool_ref<soul::Module> *)__range3);
    ___begin3 = Module::Functions::get(&pMVar3->functions);
    local_40 = (ArrayView<soul::pool_ref<soul::heart::Function>_> *)&__begin3;
    __end3 = ArrayView<soul::pool_ref<soul::heart::Function>_>::begin(local_40);
    ppVar4 = ArrayView<soul::pool_ref<soul::heart::Function>_>::end(local_40);
    for (; __end3 != ppVar4; __end3 = __end3 + 1) {
      pFVar5 = pool_ref<soul::heart::Function>::operator->(__end3);
      pFVar5->localVariableStackSize = 0;
    }
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
    ::operator++(&__end2);
  }
  CallSequenceCheckResults::CallSequenceCheckResults(__return_storage_ptr__);
  pvVar2 = Program::getModules(program);
  __end2_1 = std::
             vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::
             begin(pvVar2);
  m_1 = (pool_ref<soul::Module> *)
        std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::
        end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                        *)&m_1);
    if (!bVar1) break;
    __range3_1 = (ArrayView<soul::pool_ref<soul::heart::Function>_> *)
                 __gnu_cxx::
                 __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                 ::operator*(&__end2_1);
    pMVar3 = pool_ref<soul::Module>::operator->((pool_ref<soul::Module> *)__range3_1);
    AVar6 = Module::Functions::get(&pMVar3->functions);
    local_98 = &local_a8;
    local_a8 = AVar6;
    __end3_1 = ArrayView<soul::pool_ref<soul::heart::Function>_>::begin(local_98);
    ppVar4 = ArrayView<soul::pool_ref<soul::heart::Function>_>::end(local_98);
    for (; __end3_1 != ppVar4; __end3_1 = __end3_1 + 1) {
      pFVar5 = pool_ref::operator_cast_to_Function_((pool_ref *)__end3_1);
      iterateCallSequences(pFVar5,__return_storage_ptr__,(PreviousCall *)0x0,0);
    }
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
    ::operator++(&__end2_1);
  }
  return __return_storage_ptr__;
}

Assistant:

static CallSequenceCheckResults checkFunctionCallSequences (const Program& program)
    {
        for (auto& m : program.getModules())
            for (auto& f : m->functions.get())
                f->localVariableStackSize = 0;

        CallSequenceCheckResults results;

        for (auto& m : program.getModules())
            for (auto& f : m->functions.get())
                iterateCallSequences (f, results, nullptr, 0);

        return results;
    }